

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O0

void __thiscall
NaStateSpaceModel::SetMatrices
          (NaStateSpaceModel *this,NaMatrix *mA,NaMatrix *mB,NaMatrix *mC,NaMatrix *mD)

{
  int iVar1;
  uint nInDim_;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  NaUnit *in_RDI;
  long *in_R8;
  
  iVar1 = (**(code **)(*in_RSI + 0x38))();
  if (iVar1 != 0) {
    iVar1 = (**(code **)(*in_RSI + 0x30))();
    if (iVar1 != 0) {
      iVar1 = (**(code **)(*in_RDX + 0x38))();
      if (iVar1 != 0) {
        iVar1 = (**(code **)(*in_RDX + 0x30))();
        if (iVar1 != 0) {
          iVar1 = (**(code **)(*in_RCX + 0x38))();
          if (iVar1 != 0) {
            iVar1 = (**(code **)(*in_RCX + 0x30))();
            if (iVar1 != 0) {
              iVar1 = (**(code **)(*in_R8 + 0x38))();
              if (iVar1 != 0) {
                iVar1 = (**(code **)(*in_R8 + 0x30))();
                if (iVar1 != 0) {
                  nInDim_ = (**(code **)(*in_RSI + 0x30))();
                  uVar2 = (**(code **)(*in_RSI + 0x38))();
                  if (nInDim_ == uVar2) {
                    uVar2 = (**(code **)(*in_RSI + 0x30))();
                    uVar3 = (**(code **)(*in_RDX + 0x30))();
                    if (uVar2 == uVar3) {
                      uVar3 = (**(code **)(*in_RSI + 0x30))();
                      uVar4 = (**(code **)(*in_RCX + 0x38))();
                      if (uVar3 == uVar4) {
                        iVar1 = (**(code **)(*in_RCX + 0x30))();
                        iVar5 = (**(code **)(*in_R8 + 0x30))();
                        if (iVar1 == iVar5) {
                          iVar1 = (**(code **)(*in_RDX + 0x38))();
                          iVar5 = (**(code **)(*in_R8 + 0x38))();
                          if (iVar1 == iVar5) {
                            NaMatrix::operator=((NaMatrix *)in_RDI,
                                                (NaMatrix *)CONCAT44(nInDim_,uVar2));
                            NaMatrix::operator=((NaMatrix *)in_RDI,
                                                (NaMatrix *)CONCAT44(nInDim_,uVar2));
                            NaMatrix::operator=((NaMatrix *)in_RDI,
                                                (NaMatrix *)CONCAT44(nInDim_,uVar2));
                            NaMatrix::operator=((NaMatrix *)in_RDI,
                                                (NaMatrix *)CONCAT44(nInDim_,uVar2));
                            uVar4 = NaMatrix::dim_rows((NaMatrix *)&in_RDI[2].nInDim);
                            *(uint *)&in_RDI[2].super_NaLogging._vptr_NaLogging = uVar4;
                            uVar4 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 4));
                            *(uint *)((long)&in_RDI[2].super_NaLogging._vptr_NaLogging + 4) = uVar4;
                            uVar4 = NaMatrix::dim_cols((NaMatrix *)&in_RDI[3].pTimer);
                            *(uint *)&in_RDI[2].pTimer = uVar4;
                            NaUnit::Assign(in_RDI,nInDim_,uVar2,uVar3);
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 2;
  __cxa_throw(puVar6,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::SetMatrices (const NaMatrix& mA,
				const NaMatrix& mB,
				const NaMatrix& mC,
				const NaMatrix& mD)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mC.dim_cols() > 0 && mC.dim_rows() > 0 &&
         mD.dim_cols() > 0 && mD.dim_rows() > 0 &&
         mA.dim_rows() == mA.dim_cols() &&
         mA.dim_rows() == mB.dim_rows() &&
         mA.dim_rows() == mC.dim_cols() &&
         mC.dim_rows() == mD.dim_rows() &&
         mB.dim_cols() == mD.dim_cols())){
	throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C = mC;
    D = mD;

    n = A.dim_rows();
    m = C.dim_rows();
    k = B.dim_cols();

    Assign(k, m);
}